

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createCompositeInsert(Builder *this,Id object,Id composite,Id typeId,uint index)

{
  Id IVar1;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  Instruction *local_28;
  Instruction *insert;
  uint index_local;
  Id typeId_local;
  Id composite_local;
  Id object_local;
  Builder *this_local;
  
  insert._0_4_ = index;
  insert._4_4_ = typeId;
  index_local = composite;
  typeId_local = object;
  _composite_local = this;
  this_00 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar1,insert._4_4_,OpCompositeInsert);
  local_28 = this_00;
  spv::Instruction::reserveOperands(this_00,3);
  spv::Instruction::addIdOperand(local_28,typeId_local);
  spv::Instruction::addIdOperand(local_28,index_local);
  spv::Instruction::addImmediateOperand(local_28,(uint)insert);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
             local_28);
  addInstruction(this,&local_30);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  IVar1 = spv::Instruction::getResultId(local_28);
  return IVar1;
}

Assistant:

Id Builder::createCompositeInsert(Id object, Id composite, Id typeId, unsigned index)
{
    Instruction* insert = new Instruction(getUniqueId(), typeId, OpCompositeInsert);
    insert->reserveOperands(3);
    insert->addIdOperand(object);
    insert->addIdOperand(composite);
    insert->addImmediateOperand(index);
    addInstruction(std::unique_ptr<Instruction>(insert));

    return insert->getResultId();
}